

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O2

void Ptex::v2_2::PtexUtils::deinterleave
               (void *src,int sstride,int uw,int vw,void *dst,int dstride,DataType dt,int nchan)

{
  undefined1 *puVar1;
  undefined2 *puVar2;
  undefined4 *puVar3;
  undefined1 *puVar4;
  undefined2 *puVar5;
  undefined4 *puVar6;
  long lVar7;
  uchar *sp;
  undefined1 *puVar8;
  undefined2 *puVar9;
  undefined4 *puVar10;
  
  if (dt - dt_uint16 < 2) {
    puVar2 = (undefined2 *)((long)src + (long)nchan * 2);
    for (; (undefined2 *)src != puVar2; src = (void *)((long)src + 2)) {
      for (puVar5 = (undefined2 *)src;
          puVar5 != (undefined2 *)((long)src + (long)(vw * (sstride / 2)) * 2);
          puVar5 = puVar5 + sstride / 2) {
        puVar9 = puVar5;
        for (lVar7 = 0; (long)uw * 2 != lVar7; lVar7 = lVar7 + 2) {
          *(undefined2 *)((long)dst + lVar7) = *puVar9;
          puVar9 = puVar9 + nchan;
        }
        dst = (void *)((long)dst + (long)(dstride / 2) * 2);
      }
    }
  }
  else if (dt == dt_float) {
    puVar3 = (undefined4 *)((long)src + (long)nchan * 4);
    for (; (undefined4 *)src != puVar3; src = (void *)((long)src + 4)) {
      for (puVar6 = (undefined4 *)src;
          puVar6 != (undefined4 *)((long)src + (long)(vw * (sstride / 4)) * 4);
          puVar6 = puVar6 + sstride / 4) {
        puVar10 = puVar6;
        for (lVar7 = 0; (long)uw * 4 != lVar7; lVar7 = lVar7 + 4) {
          *(undefined4 *)((long)dst + lVar7) = *puVar10;
          puVar10 = puVar10 + nchan;
        }
        dst = (void *)((long)dst + (long)(dstride / 4) * 4);
      }
    }
  }
  else if (dt == dt_uint8) {
    puVar1 = (undefined1 *)((long)src + (long)nchan);
    for (; (undefined1 *)src != puVar1; src = (void *)((long)src + 1)) {
      for (puVar4 = (undefined1 *)src; puVar4 != (undefined1 *)((long)src + (long)(vw * sstride));
          puVar4 = puVar4 + sstride) {
        puVar8 = puVar4;
        for (lVar7 = 0; uw != lVar7; lVar7 = lVar7 + 1) {
          *(undefined1 *)((long)dst + lVar7) = *puVar8;
          puVar8 = puVar8 + nchan;
        }
        dst = (void *)((long)dst + (long)dstride);
      }
    }
  }
  return;
}

Assistant:

void deinterleave(const void* src, int sstride, int uw, int vw,
                  void* dst, int dstride, DataType dt, int nchan)
{
    switch (dt) {
    case dt_uint8:     deinterleave((const uint8_t*) src, sstride, uw, vw,
                                    (uint8_t*) dst, dstride, nchan); break;
    case dt_half:
    case dt_uint16:    deinterleave((const uint16_t*) src, sstride, uw, vw,
                                    (uint16_t*) dst, dstride, nchan); break;
    case dt_float:     deinterleave((const float*) src, sstride, uw, vw,
                                    (float*) dst, dstride, nchan); break;
    }
}